

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adig.c
# Opt level: O2

void print_section(ares_dns_record_t *dnsrec,ares_dns_section_t section)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  undefined4 uVar4;
  uint uVar5;
  undefined4 uVar6;
  long lVar7;
  ares_dns_rr_t *paVar8;
  undefined8 uVar9;
  ulong uVar10;
  char *pcVar11;
  size_t sVar12;
  undefined8 uVar13;
  ulong uVar14;
  long *__s;
  long lVar15;
  uchar *puVar16;
  size_t i_1;
  size_t sVar17;
  long lVar18;
  size_t sVar19;
  size_t i;
  ulong uVar20;
  bool bVar21;
  undefined8 uStack_190;
  size_t val_len;
  uchar *local_168;
  undefined8 local_160;
  ares_dns_section_t local_154;
  ulong local_150;
  ares_dns_record_t *local_148;
  ulong local_140;
  long read_len;
  
  lVar7 = ares_dns_record_rr_cnt();
  if ((lVar7 != 0) &&
     ((lVar7 = ares_dns_record_rr_cnt(dnsrec,section), lVar7 != 1 ||
      (paVar8 = has_opt(dnsrec,section), paVar8 == (ares_dns_rr_t *)0x0)))) {
    if (global_config.opts.display_comments != ARES_FALSE) {
      uVar9 = ares_dns_section_tostr(section);
      printf(";; %s SECTION:\n",uVar9);
    }
    local_154 = section;
    local_148 = dnsrec;
    for (uVar20 = 0; uVar10 = ares_dns_record_rr_cnt(dnsrec,section), uVar20 < uVar10;
        uVar20 = uVar20 + 1) {
      uVar9 = ares_dns_record_rr_get_const(dnsrec,section,uVar20);
      iVar3 = ares_dns_rr_get_type(uVar9);
      if (iVar3 != 0x29) {
        local_140 = uVar20;
        pcVar11 = (char *)ares_dns_rr_get_name(uVar9);
        local_150 = 0;
        uVar4 = ares_dns_rr_get_type(uVar9);
        lVar7 = ares_dns_rr_get_keys(uVar4,&local_150);
        dnsrec = local_148;
        uVar20 = local_140;
        section = local_154;
        if (pcVar11 != (char *)0x0) {
          sVar12 = strlen(pcVar11);
          printf("%s.\t",pcVar11);
          if (sVar12 < 0x18) {
            putchar(9);
          }
          if (global_config.opts.display_ttl != ARES_FALSE) {
            uVar5 = ares_dns_rr_get_ttl(uVar9);
            printf("%u\t",(ulong)uVar5);
          }
          if (global_config.opts.display_class != ARES_FALSE) {
            uVar6 = ares_dns_rr_get_class(uVar9);
            uVar13 = ares_dns_class_tostr(uVar6);
            printf("%s\t",uVar13);
          }
          uVar13 = ares_dns_rec_type_tostr(uVar4);
          printf("%s\t",uVar13);
          for (uVar20 = 0; __s = &read_len, uVar20 < local_150; uVar20 = uVar20 + 1) {
            uVar4 = ares_dns_rr_key_datatype(*(undefined4 *)(lVar7 + uVar20 * 4));
            if (uVar20 != 0) {
              putchar(0x20);
            }
            switch(uVar4) {
            case 1:
              uVar13 = ares_dns_rr_get_addr(uVar9);
              memset(__s,0,0x100);
              uStack_190 = 2;
              goto LAB_00104e3a;
            case 2:
              uVar13 = ares_dns_rr_get_addr6(uVar9);
              memset(__s,0,0x100);
              uStack_190 = 10;
LAB_00104e3a:
              ares_inet_ntop(uStack_190,uVar13,__s,0x100);
              pcVar11 = "%s";
              goto LAB_00104e96;
            case 3:
              bVar1 = ares_dns_rr_get_u8(uVar9,*(undefined4 *)(lVar7 + uVar20 * 4));
              uVar10 = (ulong)bVar1;
              goto LAB_00104dd3;
            case 4:
              uVar2 = ares_dns_rr_get_u16(uVar9,*(undefined4 *)(lVar7 + uVar20 * 4));
              uVar10 = (ulong)uVar2;
              goto LAB_00104dd3;
            case 5:
              uVar5 = ares_dns_rr_get_u32(uVar9,*(undefined4 *)(lVar7 + uVar20 * 4));
              uVar10 = (ulong)uVar5;
LAB_00104dd3:
              printf("%u",uVar10);
              break;
            case 6:
              __s = (long *)ares_dns_rr_get_str(uVar9,*(undefined4 *)(lVar7 + uVar20 * 4));
              pcVar11 = "%s.";
              goto LAB_00104e96;
            case 7:
              __s = (long *)ares_dns_rr_get_str(uVar9,*(undefined4 *)(lVar7 + uVar20 * 4));
              pcVar11 = "\"%s\"";
LAB_00104e96:
              printf(pcVar11,__s);
              break;
            case 8:
              read_len = 0;
              puVar16 = (uchar *)ares_dns_rr_get_bin(uVar9,*(undefined4 *)(lVar7 + uVar20 * 4),__s);
              print_opt_bin(puVar16,read_len);
              break;
            case 9:
              puVar16 = (uchar *)ares_dns_rr_get_bin(uVar9,*(undefined4 *)(lVar7 + uVar20 * 4),__s);
              print_opt_binp(puVar16,read_len);
              break;
            case 10:
              uVar4 = *(undefined4 *)(lVar7 + uVar20 * 4);
              for (uVar10 = 0; uVar14 = ares_dns_rr_get_opt_cnt(uVar9,uVar4), uVar10 < uVar14;
                  uVar10 = uVar10 + 1) {
                val_len = 0;
                local_168 = (uchar *)0x0;
                if (uVar10 != 0) {
                  putchar(0x20);
                }
                uVar2 = ares_dns_rr_get_opt(uVar9,uVar4,uVar10,&local_168,&val_len);
                lVar15 = ares_dns_opt_get_name(uVar4,uVar2);
                if (lVar15 == 0) {
                  printf("key%u",(ulong)uVar2);
                }
                else {
                  printf("%s",lVar15);
                }
                if (val_len == 0) break;
                putchar(0x3d);
                uVar6 = ares_dns_opt_get_datatype(uVar4);
                puVar16 = local_168;
                sVar19 = val_len;
                switch(uVar6) {
                case 1:
                  if (val_len != 0) {
LAB_00104d09:
                    printf("INVALID!");
                  }
                  break;
                case 2:
                  putchar(0x22);
                  lVar15 = 0;
                  for (; sVar19 != 0; sVar19 = sVar19 - read_len) {
                    read_len = 0;
                    local_160 = 0;
                    bVar21 = lVar15 != 0;
                    lVar15 = lVar15 + -1;
                    if (bVar21) {
                      putchar(0x2c);
                    }
                    iVar3 = ares_expand_string(puVar16,puVar16,sVar19 & 0xffffffff,&local_160,
                                               &read_len);
                    if (iVar3 != 0) {
                      printf("INVALID");
                      break;
                    }
                    printf("%s",local_160);
                    ares_free_string(local_160);
                    puVar16 = puVar16 + read_len;
                  }
                  putchar(0x22);
                  break;
                case 3:
                  for (sVar17 = 0; sVar19 != sVar17; sVar17 = sVar17 + 1) {
                    if (sVar17 != 0) {
                      putchar(0x2c);
                    }
                    printf("%u",(ulong)puVar16[sVar17]);
                  }
                  break;
                case 4:
                case 5:
                  if ((val_len & 1) != 0 || val_len < 2) goto LAB_00104d09;
                  for (uVar14 = 0; uVar14 < sVar19; uVar14 = uVar14 + 2) {
                    uVar2 = *(ushort *)(puVar16 + uVar14);
                    if (uVar14 != 0) {
                      putchar(0x2c);
                    }
                    printf("%u",(ulong)(ushort)(uVar2 << 8 | uVar2 >> 8));
                  }
                  break;
                case 6:
                case 7:
                  if ((val_len & 3) != 0 || val_len < 4) goto LAB_00104d09;
                  for (uVar14 = 0; uVar14 < sVar19; uVar14 = uVar14 + 4) {
                    uVar5 = *(uint *)(puVar16 + uVar14);
                    if (uVar14 != 0) {
                      putchar(0x2c);
                    }
                    printf("%u",(ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 |
                                        (uVar5 & 0xff00) << 8 | uVar5 << 0x18));
                  }
                  break;
                case 8:
                  if ((val_len & 3) != 0) goto LAB_00104d09;
                  for (uVar14 = 0; uVar14 < sVar19; uVar14 = uVar14 + 4) {
                    memset(&read_len,0,0x100);
                    ares_inet_ntop(2,puVar16 + uVar14,&read_len,0x100);
                    if (uVar14 != 0) {
                      putchar(0x2c);
                    }
                    printf("%s");
                  }
                  break;
                case 9:
                  if ((val_len & 0xf) != 0) goto LAB_00104d09;
                  for (uVar14 = 0; uVar14 < sVar19; uVar14 = uVar14 + 0x10) {
                    memset(&read_len,0,0x100);
                    ares_inet_ntop(10,puVar16 + uVar14,&read_len,0x100);
                    if (uVar14 != 0) {
                      putchar(0x2c);
                    }
                    printf("%s");
                  }
                  break;
                case 10:
                  print_opt_bin(local_168,val_len);
                  break;
                case 0xb:
                  read_len = 0;
                  local_160 = 0;
                  iVar3 = ares_expand_name(local_168,local_168,val_len & 0xffffffff,&read_len,
                                           &local_160);
                  if (iVar3 != 0) goto LAB_00104d09;
                  printf("%s.",read_len);
                  ares_free_string(read_len);
                }
              }
              break;
            case 0xb:
              uVar4 = *(undefined4 *)(lVar7 + uVar20 * 4);
              lVar15 = ares_dns_rr_get_abin_cnt(uVar9,uVar4);
              for (lVar18 = 0; lVar15 != lVar18; lVar18 = lVar18 + 1) {
                puVar16 = (uchar *)ares_dns_rr_get_abin(uVar9,uVar4,lVar18,__s);
                if (lVar18 != 0) {
                  putchar(0x20);
                }
                print_opt_binp(puVar16,read_len);
              }
            }
          }
          putchar(10);
          dnsrec = local_148;
          uVar20 = local_140;
          section = local_154;
        }
      }
    }
    if (global_config.opts.display_comments != ARES_FALSE) {
      putchar(10);
    }
  }
  return;
}

Assistant:

static void print_section(const ares_dns_record_t *dnsrec,
                          ares_dns_section_t       section)
{
  size_t i;

  if (ares_dns_record_rr_cnt(dnsrec, section) == 0 ||
      (ares_dns_record_rr_cnt(dnsrec, section) == 1 &&
       has_opt(dnsrec, section) != NULL)) {
    return;
  }

  if (global_config.opts.display_comments) {
    printf(";; %s SECTION:\n", ares_dns_section_tostr(section));
  }
  for (i = 0; i < ares_dns_record_rr_cnt(dnsrec, section); i++) {
    const ares_dns_rr_t *rr = ares_dns_record_rr_get_const(dnsrec, section, i);
    if (ares_dns_rr_get_type(rr) == ARES_REC_TYPE_OPT) {
      continue;
    }
    print_rr(rr);
  }
  if (global_config.opts.display_comments) {
    printf("\n");
  }
}